

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_text.c
# Opt level: O1

void qlist_write(t_qlist *x,t_symbol *filename,t_symbol *format)

{
  char *__s1;
  int iVar1;
  char buf [1000];
  char acStack_408 [1000];
  
  canvas_makefilename((x->x_textbuf).b_canvas,filename->s_name,acStack_408,1000);
  __s1 = format->s_name;
  iVar1 = strcmp(__s1,"cr");
  if (iVar1 == 0) {
    iVar1 = 1;
  }
  else if (*__s1 == '\0') {
    iVar1 = 0;
  }
  else {
    iVar1 = 0;
    pd_error(x,"qlist_read: unknown flag: %s",__s1);
  }
  iVar1 = binbuf_write((x->x_textbuf).b_binbuf,acStack_408,"",iVar1);
  if (iVar1 != 0) {
    pd_error(x,"%s: write failed",filename->s_name);
  }
  return;
}

Assistant:

static void qlist_write(t_qlist *x, t_symbol *filename, t_symbol *format)
{
    int cr = 0;
    char buf[MAXPDSTRING];
    canvas_makefilename(x->x_canvas, filename->s_name,
        buf, MAXPDSTRING);
    if (!strcmp(format->s_name, "cr"))
        cr = 1;
    else if (*format->s_name)
        pd_error(x, "qlist_read: unknown flag: %s", format->s_name);
    if (binbuf_write(x->x_binbuf, buf, "", cr))
            pd_error(x, "%s: write failed", filename->s_name);
}